

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dlep_writer.c
# Opt level: O3

void dlep_writer_add_tlv2
               (dlep_writer *writer,uint16_t type,void *data1,uint16_t len1,void *data2,
               uint16_t len2)

{
  undefined2 in_register_0000000a;
  undefined2 in_register_0000008a;
  ushort local_2c;
  ushort local_2a;
  
  local_2a = type << 8 | type >> 8;
  abuf_memcpy(writer->out,&local_2a,2);
  local_2c = (len2 + len1) * 0x100 | (ushort)(len2 + len1) >> 8;
  abuf_memcpy(writer->out,&local_2c,2);
  abuf_memcpy(writer->out,data1,CONCAT22(in_register_0000000a,len1));
  abuf_memcpy(writer->out,data2,CONCAT22(in_register_0000008a,len2));
  return;
}

Assistant:

void
dlep_writer_add_tlv2(
  struct dlep_writer *writer, uint16_t type, const void *data1, uint16_t len1, const void *data2, uint16_t len2) {
  abuf_append_uint16(writer->out, htons(type));
  abuf_append_uint16(writer->out, htons(len1 + len2));
  abuf_memcpy(writer->out, data1, len1);
  abuf_memcpy(writer->out, data2, len2);
}